

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value>::operator()
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value,chaiscript::Boxed_Value> *this,
          Boxed_Value *param)

{
  Type_Conversions *pTVar1;
  Type_Conversions_State *pTVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Boxed_Value BVar3;
  initializer_list<chaiscript::Boxed_Value> __l;
  initializer_list<chaiscript::Boxed_Value> __l_00;
  allocator_type local_89;
  Type_Conversions_State state;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_70;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined8 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pTVar1 = (Type_Conversions *)
           param[1].m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (pTVar1 == (Type_Conversions *)0x0) {
    this_00 = &local_38;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    state.m_conversions._M_data = (Type_Conversions *)*in_RDX;
    state.m_saves._M_data = (Conversion_Saves *)in_RDX[1];
    *in_RDX = 0;
    in_RDX[1] = 0;
    local_40 = 0;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&state;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_70,__l_00,(allocator_type *)&local_58);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,
               (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)param,&local_70,(Type_Conversions_State *)0x0);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_70);
    pTVar2 = &state;
  }
  else {
    state.m_saves._M_data =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                   (&pTVar1->m_conversion_saves);
    this_00 = &local_28;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_ptr = (element_type *)*in_RDX;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    *in_RDX = 0;
    in_RDX[1] = 0;
    local_30 = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_58;
    state.m_conversions._M_data = pTVar1;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              (&local_70,__l,&local_89);
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,
               (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                *)param,&local_70,&state);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              (&local_70);
    pTVar2 = (Type_Conversions_State *)&local_58._M_ptr;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pTVar2->m_saves);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P&&  ...  param)
          {
            if (m_conversions) {
              Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, &state
                  );
            } else {
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, nullptr
                  );
            }

          }